

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::DockBuilderAddNode(ImGuiID id,ImGuiDockNodeFlags flags)

{
  ImGuiContext *ctx;
  ImGuiDockNode *pIVar1;
  ImVec2 local_20;
  
  ctx = GImGui;
  if (((uint)flags >> 10 & 1) != 0) {
    local_20.x = 0.0;
    local_20.y = 0.0;
    DockSpace(id,&local_20,(flags & 0xfffffbfeU) + 1,(ImGuiWindowClass *)0x0);
    pIVar1 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&ctx->DockContext->Nodes,id);
    goto LAB_0016850b;
  }
  if (id == 0) {
LAB_001684cc:
    pIVar1 = DockContextAddNode(ctx,id);
  }
  else {
    pIVar1 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&GImGui->DockContext->Nodes,id);
    if (pIVar1 == (ImGuiDockNode *)0x0) goto LAB_001684cc;
  }
  pIVar1->LocalFlags = flags;
LAB_0016850b:
  pIVar1->LastFrameAlive = ctx->FrameCount;
  return pIVar1->ID;
}

Assistant:

ImGuiID ImGui::DockBuilderAddNode(ImGuiID id, ImGuiDockNodeFlags flags)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = NULL;
    if (flags & ImGuiDockNodeFlags_DockSpace)
    {
        DockSpace(id, ImVec2(0, 0), (flags & ~ImGuiDockNodeFlags_DockSpace) | ImGuiDockNodeFlags_KeepAliveOnly);
        node = DockContextFindNodeByID(ctx, id);
    }
    else
    {
        if (id != 0)
            node = DockContextFindNodeByID(ctx, id);
        if (!node)
            node = DockContextAddNode(ctx, id);
        node->LocalFlags = flags;
    }
    node->LastFrameAlive = ctx->FrameCount;   // Set this otherwise BeginDocked will undock during the same frame.
    return node->ID;
}